

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

bool __thiscall tinyusdz::crate::CrateReader::ReadFieldSets(CrateReader *this)

{
  pointer *ppcVar1;
  byte bVar2;
  pointer pSVar3;
  StreamReader *pSVar4;
  uint64_t uVar5;
  pointer pIVar6;
  long *plVar7;
  bool bVar8;
  long *plVar9;
  ostream *poVar10;
  undefined8 *puVar11;
  ulong uVar12;
  size_t __new_size;
  size_t __new_size_00;
  size_type *psVar13;
  ulong *puVar14;
  long lVar15;
  int iVar16;
  pointer pcVar17;
  char *pcVar18;
  pointer pcVar19;
  unsigned_long *in_R8;
  size_t nbytes;
  long *__n;
  uint uVar20;
  vector<char,_std::allocator<char>_> comp_buffer;
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmp;
  vector<char,_std::allocator<char>_> working_space;
  uint64_t num_fieldsets;
  uint64_t fsets_size;
  string __str_1;
  string __str_2;
  string err;
  string local_2b8;
  vector<char,_std::allocator<char>_> local_298;
  long lStack_280;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_278;
  undefined8 uStack_260;
  vector<char,_std::allocator<char>_> local_258;
  long lStack_240;
  string local_230;
  long *local_210 [2];
  long local_200 [2];
  pointer *local_1f0;
  long local_1e8;
  pointer local_1e0 [2];
  StreamReader *local_1d0;
  pointer *local_1c8;
  long local_1c0;
  pointer local_1b8 [2];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  lVar15 = this->_fieldsets_index;
  if ((lVar15 < 0) ||
     (pSVar3 = (this->_toc).sections.
               super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (long)(this->_toc).sections.
           super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>.
           _M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 5 <= lVar15))
  goto LAB_001dea31;
  bVar2 = this->_version[0];
  if ((bVar2 != 0) || (3 < this->_version[1])) {
    pSVar4 = this->_sr;
    uVar12 = pSVar3[lVar15].start;
    if (pSVar4->length_ < uVar12) {
LAB_001dea31:
      ::std::__cxx11::string::append((char *)&this->_err);
      return false;
    }
    pSVar4->idx_ = uVar12;
    bVar8 = StreamReader::read8(pSVar4,(uint64_t *)&local_230);
    if (!bVar8) goto LAB_001dea31;
    if (local_230._M_dataplus._M_p == (pointer)0x0) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadFieldSets",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(local_1a8,0x16b9);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      pcVar18 = "`FIELDSETS` is empty.";
      lVar15 = 0x15;
LAB_001df2f5:
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar18,lVar15);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_2b8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p == &local_2b8.field_2) goto LAB_001df354;
    }
    else {
      if (local_230._M_dataplus._M_p <= (pointer)(this->_config).maxNumFieldSets) {
        uVar12 = (long)local_230._M_dataplus._M_p * 4 + this->_memoryUsage;
        this->_memoryUsage = uVar12;
        if ((this->_config).maxMemoryBudget < uVar12) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ReadFieldSets",0xd);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          iVar16 = 0x16c1;
        }
        else {
          ::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::resize
                    (&this->_fieldset_indices,(size_type)local_230._M_dataplus._M_p);
          __new_size = Usd_IntegerCompression::GetCompressedBufferSize
                                 ((size_t)local_230._M_dataplus._M_p);
          uVar12 = this->_memoryUsage + __new_size;
          this->_memoryUsage = uVar12;
          if (uVar12 <= (this->_config).maxMemoryBudget) {
            local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (char *)0x0;
            local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ::std::vector<char,_std::allocator<char>_>::resize(&local_298,__new_size);
            uVar12 = (long)local_230._M_dataplus._M_p * 4 + this->_memoryUsage;
            this->_memoryUsage = uVar12;
            if ((this->_config).maxMemoryBudget < uVar12) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReadFieldSets",0xd);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<(local_1a8,0x16ce);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Reached to max memory budget.",0x1d);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::_M_append
                        ((char *)&this->_err,(ulong)local_2b8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                operator_delete(local_2b8._M_dataplus._M_p,
                                local_2b8.field_2._M_allocated_capacity + 1);
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              ::std::ios_base::~ios_base(local_138);
              bVar8 = false;
              goto LAB_001df90f;
            }
            local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (uint32_t *)0x0;
            local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                      (&local_278,(size_type)local_230._M_dataplus._M_p);
            __new_size_00 =
                 Usd_IntegerCompression::GetDecompressionWorkingSpaceSize
                           ((size_t)local_230._M_dataplus._M_p);
            uVar12 = this->_memoryUsage + __new_size_00;
            this->_memoryUsage = uVar12;
            if ((this->_config).maxMemoryBudget < uVar12) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReadFieldSets",0xd);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<(local_1a8,0x16d5);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Reached to max memory budget.",0x1d);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::_M_append
                        ((char *)&this->_err,(ulong)local_2b8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                operator_delete(local_2b8._M_dataplus._M_p,
                                local_2b8.field_2._M_allocated_capacity + 1);
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              ::std::ios_base::~ios_base(local_138);
              bVar8 = false;
            }
            else {
              local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (char *)0x0;
              local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              ::std::vector<char,_std::allocator<char>_>::resize(&local_258,__new_size_00);
              bVar8 = StreamReader::read8(this->_sr,(uint64_t *)local_210);
              if (bVar8) {
                if (local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish +
                    -(long)local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start < local_210[0]) {
                  local_210[0] = (long *)(local_298.super__Vector_base<char,_std::allocator<char>_>.
                                          _M_impl.super__Vector_impl_data._M_finish +
                                         -(long)local_298.
                                                super__Vector_base<char,_std::allocator<char>_>.
                                                _M_impl.super__Vector_impl_data._M_start);
                }
                plVar7 = local_210[0];
                pSVar4 = this->_sr;
                plVar9 = (long *)pSVar4->length_;
                if (plVar9 < local_210[0]) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"[Crate]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"ReadFieldSets",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3)
                  ;
                  poVar10 = (ostream *)::std::ostream::operator<<(local_1a8,0x16e7);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                  pcVar18 = "FieldSets compressed data exceeds USDC data.";
                  lVar15 = 0x2c;
                  goto LAB_001df85f;
                }
                uVar5 = pSVar4->idx_;
                __n = (long *)((long)plVar9 - uVar5);
                if ((long *)((long)local_210[0] + uVar5) <= plVar9) {
                  __n = local_210[0];
                }
                if ((long *)((long)__n - 1U) < local_210[0]) {
                  local_1d0 = pSVar4;
                  memcpy(local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,pSVar4->binary_ + uVar5,(size_t)__n);
                  local_1d0->idx_ = (long)__n + local_1d0->idx_;
                }
                else {
                  __n = (long *)0x0;
                }
                if (plVar7 != __n) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"[Crate]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"ReadFieldSets",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3)
                  ;
                  poVar10 = (ostream *)::std::ostream::operator<<(local_1a8,0x16ed);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                  pcVar18 = "Failed to read fieldsets data at `FIELDSETS` section.";
                  goto LAB_001df85a;
                }
                local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
                local_1a8[0]._M_string_length = 0;
                local_1a8[0].field_2._M_allocated_capacity =
                     local_1a8[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
                Usd_IntegerCompression::DecompressFromBuffer
                          (local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,(size_t)local_210[0],
                           local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (size_t)local_230._M_dataplus._M_p,local_1a8,
                           local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
                bVar8 = local_1a8[0]._M_string_length == 0;
                if (bVar8) {
                  if (local_230._M_dataplus._M_p != (pointer)0x0) {
                    pIVar6 = (this->_fieldset_indices).
                             super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    pcVar19 = (pointer)0x0;
                    do {
                      pIVar6[(long)pcVar19].value =
                           local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start[(long)pcVar19];
                      pcVar19 = pcVar19 + 1;
                    } while (local_230._M_dataplus._M_p != pcVar19);
                  }
                  if (this->_memoryUsage < __new_size_00) {
                    this->_memoryUsage = this->_memoryUsage - __new_size_00;
                  }
                  if (this->_memoryUsage < __new_size) {
                    this->_memoryUsage = this->_memoryUsage - __new_size;
                  }
                }
                else {
                  ::std::__cxx11::string::_M_append
                            ((char *)&this->_err,(ulong)local_1a8[0]._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
                  operator_delete(local_1a8[0]._M_dataplus._M_p,
                                  local_1a8[0].field_2._M_allocated_capacity + 1);
                }
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"[Crate]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"ReadFieldSets",0xd);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
                poVar10 = (ostream *)::std::ostream::operator<<(local_1a8,0x16db);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                pcVar18 = "Failed to read fieldsets size at `FIELDSETS` section.";
LAB_001df85a:
                lVar15 = 0x35;
LAB_001df85f:
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,pcVar18,lVar15);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::_M_append
                          ((char *)&this->_err,(ulong)local_2b8._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                  operator_delete(local_2b8._M_dataplus._M_p,
                                  local_2b8.field_2._M_allocated_capacity + 1);
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                ::std::ios_base::~ios_base(local_138);
                bVar8 = false;
              }
              if (local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start != (char *)0x0) {
                operator_delete(local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_258.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_258.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
            }
            if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (uint32_t *)0x0) {
              operator_delete(local_278.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_278.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_278.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
LAB_001df90f:
            if (local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start != (char *)0x0) {
              operator_delete(local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_298.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_298.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
              return bVar8;
            }
            return bVar8;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ReadFieldSets",0xd);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          iVar16 = 0x16c9;
        }
        poVar10 = (ostream *)::std::ostream::operator<<(local_1a8,iVar16);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        pcVar18 = "Reached to max memory budget.";
        lVar15 = 0x1d;
        goto LAB_001df2f5;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadFieldSets",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(local_1a8,0x16be);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      ppcVar1 = &local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)ppcVar1;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_298,"Too many FieldSets {}. maxNumFieldSets is set to {}","");
      fmt::format<unsigned_long,unsigned_long>
                (&local_2b8,(fmt *)&local_298,&local_230,&(this->_config).maxNumFieldSets,in_R8);
      poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,local_2b8._M_dataplus._M_p,
                           local_2b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      if ((pointer *)
          local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != ppcVar1) {
        operator_delete(local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (ulong)(local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 1));
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_2b8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p == &local_2b8.field_2) goto LAB_001df354;
    }
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
LAB_001df354:
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    ::std::ios_base::~ios_base(local_138);
    return false;
  }
  local_210[0] = local_200;
  ::std::__cxx11::string::_M_construct((ulong)local_210,'\x01');
  ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_210[0],1,(uint)bVar2);
  plVar9 = (long *)::std::__cxx11::string::replace((ulong)local_210,0,(char *)0x0,0x42a8d8);
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  psVar13 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_230.field_2._M_allocated_capacity = *psVar13;
    local_230.field_2._8_8_ = plVar9[3];
  }
  else {
    local_230.field_2._M_allocated_capacity = *psVar13;
    local_230._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_230._M_string_length = plVar9[1];
  *plVar9 = (long)psVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)::std::__cxx11::string::append((char *)&local_230);
  ppcVar1 = &local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  puVar14 = (ulong *)(plVar9 + 2);
  if ((pointer *)*plVar9 == (pointer *)puVar14) {
    local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*puVar14;
    lStack_240 = plVar9[3];
    local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)ppcVar1;
  }
  else {
    local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*puVar14;
    local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*plVar9;
  }
  local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)plVar9[1];
  *plVar9 = (long)puVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  bVar2 = this->_version[1];
  uVar20 = 1;
  if (9 < bVar2) {
    uVar20 = 3 - (bVar2 < 100);
  }
  local_1f0 = local_1e0;
  ::std::__cxx11::string::_M_construct((ulong)&local_1f0,(char)uVar20);
  ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1f0,uVar20,(uint)bVar2);
  pcVar17 = (pointer)0xf;
  if ((pointer *)
      local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != ppcVar1) {
    pcVar17 = local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  }
  if (pcVar17 < local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish + local_1e8) {
    pcVar17 = (pointer)0xf;
    if (local_1f0 != local_1e0) {
      pcVar17 = local_1e0[0];
    }
    if (pcVar17 < local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish + local_1e8) goto LAB_001dedee;
    puVar11 = (undefined8 *)
              ::std::__cxx11::string::replace
                        ((ulong)&local_1f0,0,(char *)0x0,
                         (ulong)local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
  }
  else {
LAB_001dedee:
    puVar11 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1f0);
  }
  local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  plVar9 = puVar11 + 2;
  if ((pointer *)*puVar11 == (pointer *)plVar9) {
    local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar9;
    uStack_260 = puVar11[3];
  }
  else {
    local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar9;
    local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*puVar11;
  }
  local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)puVar11[1];
  *puVar11 = plVar9;
  puVar11[1] = 0;
  *(undefined1 *)plVar9 = 0;
  plVar9 = (long *)::std::__cxx11::string::append((char *)&local_278);
  ppcVar1 = &local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  puVar14 = (ulong *)(plVar9 + 2);
  if ((pointer *)*plVar9 == (pointer *)puVar14) {
    local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*puVar14;
    lStack_280 = plVar9[3];
    local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)ppcVar1;
  }
  else {
    local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*puVar14;
    local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*plVar9;
  }
  local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)plVar9[1];
  *plVar9 = (long)puVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  bVar2 = this->_version[2];
  uVar20 = 1;
  if (9 < bVar2) {
    uVar20 = 3 - (bVar2 < 100);
  }
  local_1c8 = local_1b8;
  ::std::__cxx11::string::_M_construct((ulong)&local_1c8,(char)uVar20);
  ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1c8,uVar20,(uint)bVar2);
  pcVar17 = (pointer)0xf;
  if ((pointer *)
      local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != ppcVar1) {
    pcVar17 = local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  }
  if (pcVar17 < local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish + local_1c0) {
    pcVar17 = (pointer)0xf;
    if (local_1c8 != local_1b8) {
      pcVar17 = local_1b8[0];
    }
    if (local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish + local_1c0 <= pcVar17) {
      puVar11 = (undefined8 *)
                ::std::__cxx11::string::replace
                          ((ulong)&local_1c8,0,(char *)0x0,
                           (ulong)local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
      goto LAB_001df022;
    }
  }
  puVar11 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_1c8);
LAB_001df022:
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_2b8.field_2._M_allocated_capacity = *psVar13;
    local_2b8.field_2._8_8_ = puVar11[3];
  }
  else {
    local_2b8.field_2._M_allocated_capacity = *psVar13;
    local_2b8._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_2b8._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  plVar9 = (long *)::std::__cxx11::string::append((char *)&local_2b8);
  psVar13 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_1a8[0].field_2._0_8_ = *psVar13;
    local_1a8[0].field_2._8_8_ = plVar9[3];
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  }
  else {
    local_1a8[0].field_2._0_8_ = *psVar13;
    local_1a8[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_1a8[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1a8[0]._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,(ulong)(local_1b8[0] + 1));
  }
  if ((pointer *)
      local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != ppcVar1) {
    operator_delete(local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1));
  }
  if ((pointer *)
      local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,(ulong)(local_1e0[0] + 1));
  }
  if ((pointer *)
      local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if (local_210[0] != local_200) {
    operator_delete(local_210[0],local_200[0] + 1);
  }
  return false;
}

Assistant:

bool CrateReader::ReadFieldSets() {
  if ((_fieldsets_index < 0) ||
      (_fieldsets_index >= int64_t(_toc.sections.size()))) {
    _err += "Invalid index for `FIELDSETS` section.\n";
    return false;
  }

  if ((_version[0] == 0) && (_version[1] < 4)) {
    _err += "Version must be 0.4.0 or later, but got " +
            std::to_string(_version[0]) + "." + std::to_string(_version[1]) +
            "." + std::to_string(_version[2]) + "\n";
    return false;
  }

  const crate::Section &s = _toc.sections[size_t(_fieldsets_index)];

  if (!_sr->seek_set(uint64_t(s.start))) {
    _err += "Failed to move to `FIELDSETS` section.\n";
    return false;
  }

  uint64_t num_fieldsets;
  if (!_sr->read8(&num_fieldsets)) {
    _err += "Failed to read # of fieldsets at `FIELDSETS` section.\n";
    return false;
  }

  if (num_fieldsets == 0) {
    // At least 1 FieldIndex(separator(~0)) must exist.
    PUSH_ERROR("`FIELDSETS` is empty.");
    return false;
  }

  if (num_fieldsets > _config.maxNumFieldSets) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Too many FieldSets {}. maxNumFieldSets is set to {}", num_fieldsets, _config.maxNumFieldSets));
  }

  CHECK_MEMORY_USAGE(size_t(num_fieldsets) * sizeof(uint32_t));

  _fieldset_indices.resize(static_cast<size_t>(num_fieldsets));

  // Create temporary space for decompressing.
  size_t compBufferSize = Usd_IntegerCompression::GetCompressedBufferSize(
      static_cast<size_t>(num_fieldsets));

  CHECK_MEMORY_USAGE(compBufferSize);

  std::vector<char> comp_buffer;
  comp_buffer.resize(compBufferSize);

  CHECK_MEMORY_USAGE(sizeof(uint32_t) * size_t(num_fieldsets));
  std::vector<uint32_t> tmp;
  tmp.resize(static_cast<size_t>(num_fieldsets));

  size_t workBufferSize = Usd_IntegerCompression::GetDecompressionWorkingSpaceSize(
          static_cast<size_t>(num_fieldsets));

  CHECK_MEMORY_USAGE(workBufferSize);
  std::vector<char> working_space;
  working_space.resize(workBufferSize);

  uint64_t fsets_size;
  if (!_sr->read8(&fsets_size)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read fieldsets size at `FIELDSETS` section.");
  }

  DCOUT("num_fieldsets = " << num_fieldsets << ", fsets_size = " << fsets_size
                           << ", comp_buffer.size = " << comp_buffer.size());

  if (fsets_size > comp_buffer.size()) {
    // Maybe corrupted?
    fsets_size = comp_buffer.size();
  }

  if (fsets_size > _sr->size()) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "FieldSets compressed data exceeds USDC data.");
  }

  if (fsets_size !=
      _sr->read(size_t(fsets_size), size_t(fsets_size),
                reinterpret_cast<uint8_t *>(comp_buffer.data()))) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read fieldsets data at `FIELDSETS` section.");
  }

  std::string err;
  Usd_IntegerCompression::DecompressFromBuffer(
      comp_buffer.data(), size_t(fsets_size), tmp.data(), size_t(num_fieldsets),
      &err, working_space.data());

  if (!err.empty()) {
    _err += err;
    return false;
  }

  for (size_t i = 0; i != num_fieldsets; ++i) {
    DCOUT("fieldset_index[" << i << "] = " << tmp[i]);
    _fieldset_indices[i].value = tmp[i];
  }

  REDUCE_MEMORY_USAGE(workBufferSize);
  REDUCE_MEMORY_USAGE(compBufferSize);

  return true;
}